

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmMakefileTargetGenerator.cxx
# Opt level: O0

void __thiscall
cmMakefileTargetGenerator::AddIncludeFlags
          (cmMakefileTargetGenerator *this,string *flags,string *lang,string *param_3)

{
  cmGeneratorTarget *pcVar1;
  cmLocalUnixMakefileGenerator3 *pcVar2;
  bool forResponseFile;
  ulong uVar3;
  string *psVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *makefile_depends;
  string local_1a0;
  undefined1 local_180 [8];
  string arg;
  string name;
  string responseFlag;
  undefined1 local_100 [8];
  string responseFlagVar;
  string local_d8;
  undefined1 local_b8 [8];
  string includeFlags;
  undefined1 local_78 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  includes;
  undefined1 local_48 [7];
  bool useResponseFile;
  string responseVar;
  string *param_3_local;
  string *lang_local;
  string *flags_local;
  cmMakefileTargetGenerator *this_local;
  
  responseVar.field_2._8_8_ = param_3;
  cmStrCat<char_const(&)[7],std::__cxx11::string_const&,char_const(&)[32]>
            ((string *)local_48,(char (*) [7])0x104930a,lang,
             (char (*) [32])"_USE_RESPONSE_FILE_FOR_INCLUDES");
  forResponseFile =
       cmMakefile::IsOn((this->super_cmCommonTargetGenerator).Makefile,(string *)local_48);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_78);
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar2 = this->LocalGenerator;
  GetConfigName_abi_cxx11_((string *)((long)&includeFlags.field_2 + 8),this);
  cmLocalGenerator::GetIncludeDirectories
            ((cmLocalGenerator *)pcVar2,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_78,pcVar1,lang,(string *)((long)&includeFlags.field_2 + 8));
  std::__cxx11::string::~string((string *)(includeFlags.field_2._M_local_buf + 8));
  pcVar1 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar2 = this->LocalGenerator;
  GetConfigName_abi_cxx11_(&local_d8,this);
  cmLocalGenerator::GetIncludeFlags
            ((string *)local_b8,(cmLocalGenerator *)pcVar2,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_78,pcVar1,lang,&local_d8,forResponseFile);
  std::__cxx11::string::~string((string *)&local_d8);
  uVar3 = std::__cxx11::string::empty();
  if ((uVar3 & 1) == 0) {
    if (forResponseFile) {
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&responseFlag.field_2 + 8),"CMAKE_",lang);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_100,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&responseFlag.field_2 + 8),"_RESPONSE_FILE_FLAG");
      std::__cxx11::string::~string((string *)(responseFlag.field_2._M_local_buf + 8));
      psVar4 = cmMakefile::GetSafeDefinition
                         ((this->super_cmCommonTargetGenerator).Makefile,(string *)local_100);
      std::__cxx11::string::string((string *)(name.field_2._M_local_buf + 8),(string *)psVar4);
      uVar3 = std::__cxx11::string::empty();
      if ((uVar3 & 1) != 0) {
        std::__cxx11::string::operator=((string *)(name.field_2._M_local_buf + 8),"@");
      }
      cmStrCat<char_const(&)[10],std::__cxx11::string_const&,char_const(&)[5]>
                ((string *)((long)&arg.field_2 + 8),(char (*) [10])"includes_",lang,
                 (char (*) [5])0x108ed0e);
      makefile_depends =
           &std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmMakefileTargetGenerator::StringList,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmMakefileTargetGenerator::StringList>_>_>
            ::operator[](&this->FlagFileDepends,lang)->
            super_vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ;
      CreateResponseFile(&local_1a0,this,(string *)((long)&arg.field_2 + 8),(string *)local_b8,
                         makefile_depends,lang);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_180,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&name.field_2 + 8),&local_1a0);
      std::__cxx11::string::~string((string *)&local_1a0);
      (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
        super_cmOutputConverter._vptr_cmOutputConverter[7])(this->LocalGenerator,flags,local_180);
      std::__cxx11::string::~string((string *)local_180);
      std::__cxx11::string::~string((string *)(arg.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)(name.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_100);
    }
    else {
      (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
        super_cmOutputConverter._vptr_cmOutputConverter[7])(this->LocalGenerator,flags,local_b8);
    }
    responseFlagVar.field_2._12_4_ = 0;
  }
  else {
    responseFlagVar.field_2._12_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_b8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_78);
  std::__cxx11::string::~string((string *)local_48);
  return;
}

Assistant:

void cmMakefileTargetGenerator::AddIncludeFlags(std::string& flags,
                                                const std::string& lang,
                                                const std::string& /*config*/)
{
  std::string const responseVar =
    cmStrCat("CMAKE_", lang, "_USE_RESPONSE_FILE_FOR_INCLUDES");
  bool const useResponseFile = this->Makefile->IsOn(responseVar);

  std::vector<std::string> includes;
  this->LocalGenerator->GetIncludeDirectories(includes, this->GeneratorTarget,
                                              lang, this->GetConfigName());

  std::string const includeFlags = this->LocalGenerator->GetIncludeFlags(
    includes, this->GeneratorTarget, lang, this->GetConfigName(),
    useResponseFile);
  if (includeFlags.empty()) {
    return;
  }

  if (useResponseFile) {
    std::string const responseFlagVar =
      "CMAKE_" + lang + "_RESPONSE_FILE_FLAG";
    std::string responseFlag =
      this->Makefile->GetSafeDefinition(responseFlagVar);
    if (responseFlag.empty()) {
      responseFlag = "@";
    }
    std::string const name = cmStrCat("includes_", lang, ".rsp");
    std::string const arg = std::move(responseFlag) +
      this->CreateResponseFile(name, includeFlags, this->FlagFileDepends[lang],
                               lang);
    this->LocalGenerator->AppendFlags(flags, arg);
  } else {
    this->LocalGenerator->AppendFlags(flags, includeFlags);
  }
}